

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall Variable_connectionId_Test::TestBody(Variable_connectionId_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_e8 [8];
  Message local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  string local_a0 [32];
  AssertHelper local_80 [8];
  Message local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  undefined1 local_30 [8];
  VariablePtr v2;
  VariablePtr v1;
  Variable_connectionId_Test *this_local;
  
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::addEquivalence
            ((shared_ptr *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr *)local_30);
  libcellml::Variable::equivalenceConnectionId_abi_cxx11_
            ((shared_ptr *)&local_70,
             (shared_ptr *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_50,"\"\"",
             "libcellml::Variable::equivalenceConnectionId(v1, v2)",(char (*) [1])0x12603e,&local_70
            );
  std::__cxx11::string::~string((string *)&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=(local_80,local_78);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::Message::~Message(local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"connection_id",(allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  libcellml::Variable::setEquivalenceConnectionId
            ((shared_ptr *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr *)local_30,local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  libcellml::Variable::equivalenceConnectionId_abi_cxx11_
            ((shared_ptr *)&local_d8,
             (shared_ptr *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::EqHelper<false>::Compare<char[14],std::__cxx11::string>
            ((EqHelper<false> *)local_b8,"\"connection_id\"",
             "libcellml::Variable::equivalenceConnectionId(v1, v2)",(char (*) [14])"connection_id",
             &local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x82,pcVar2);
    testing::internal::AssertHelper::operator=(local_e8,local_e0);
    testing::internal::AssertHelper::~AssertHelper(local_e8);
    testing::Message::~Message(local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_30);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Variable, connectionId)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::Variable::addEquivalence(v1, v2);

    EXPECT_EQ("", libcellml::Variable::equivalenceConnectionId(v1, v2));

    libcellml::Variable::setEquivalenceConnectionId(v1, v2, "connection_id");
    EXPECT_EQ("connection_id", libcellml::Variable::equivalenceConnectionId(v1, v2));
}